

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

vector<double> * __thiscall
mat_lib::vector<double>::operator+
          (vector<double> *__return_storage_ptr__,vector<double> *this,vector<double> *rhs)

{
  ulong uVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  logic_error *this_00;
  ulong uVar5;
  
  if (this->max_size__ == rhs->max_size__) {
    vector(__return_storage_ptr__,this->max_size__);
    uVar1 = rhs->max_size__;
    pdVar2 = (rhs->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (__return_storage_ptr__->container__).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    for (uVar5 = 0; uVar5 < uVar1; uVar5 = uVar5 + 1) {
      pdVar4[uVar5] = pdVar3[uVar5] + pdVar2[uVar5];
    }
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"bad sum operations");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

vector operator+(const vector &rhs){
          if(this->size() != rhs.size()) throw logic_error("bad sum operations");
          vector<element_t> res(this->size());

          for (int i = 0; i < rhs.size(); ++i) {
              res.set(i,container__[i] + rhs[i]);
          }

          return res;
      }